

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.hpp
# Opt level: O0

void __thiscall xercesc_4_0::DatatypeValidator::setPattern(DatatypeValidator *this,XMLCh *pattern)

{
  XMLCh *pXVar1;
  RegularExpression *this_00;
  XMLCh *pattern_local;
  DatatypeValidator *this_local;
  
  if (this->fPattern != (XMLCh *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPattern);
    if (this->fRegex != (RegularExpression *)0x0) {
      (*this->fRegex->_vptr_RegularExpression[1])();
    }
  }
  pXVar1 = XMLString::replicate(pattern,this->fMemoryManager);
  this->fPattern = pXVar1;
  this_00 = (RegularExpression *)XMemory::operator_new(0x70,this->fMemoryManager);
  RegularExpression::RegularExpression(this_00,this->fPattern,L"X",this->fMemoryManager);
  this->fRegex = this_00;
  return;
}

Assistant:

inline void DatatypeValidator::setPattern(const XMLCh* pattern)
{
    if (fPattern) {
        fMemoryManager->deallocate(fPattern);//delete [] fPattern;
        delete fRegex;
    }
    fPattern = XMLString::replicate(pattern, fMemoryManager);
    fRegex = new (fMemoryManager) RegularExpression(fPattern, SchemaSymbols::fgRegEx_XOption, fMemoryManager);
}